

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

int Search::select_learner
              (search_private *priv,int policy,size_t learner_id,bool is_training,bool is_local)

{
  int p;
  bool is_local_local;
  bool is_training_local;
  size_t learner_id_local;
  int policy_local;
  search_private *priv_local;
  int local_4;
  
  learner_id_local._0_4_ = (int)learner_id;
  local_4 = policy;
  if (-1 < policy) {
    if (((priv->xv & 1U) != 0) && (learner_id_local._0_4_ = (int)learner_id_local * 3, !is_local)) {
      learner_id_local._0_4_ =
           (is_training != ((priv->all->sd->example_number & 1) == 1)) + 1 + (int)learner_id_local;
    }
    local_4 = policy * (int)priv->num_learners + (int)learner_id_local;
  }
  return local_4;
}

Assistant:

int select_learner(search_private& priv, int policy, size_t learner_id, bool is_training, bool is_local)
{
  if (policy < 0)
    return policy;  // optimal policy
  else
  {
    if (priv.xv)
    {
      learner_id *= 3;
      if (!is_local)
        learner_id += 1 + (size_t)(is_training ^ (priv.all->sd->example_number % 2 == 1));
    }
    int p = (int)(policy * priv.num_learners + learner_id);
    return p;
  }
}